

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int quicly_decode_transport_parameter_list
              (quicly_transport_parameters_t *params,quicly_cid_t *original_dcid,
              quicly_cid_t *initial_scid,quicly_cid_t *retry_scid,void *stateless_reset_token,
              uint8_t *src,uint8_t *end,int recognize_delayed_ack)

{
  undefined8 uVar1;
  quicly_cid_t *pqVar2;
  int iVar3;
  uint64_t uVar4;
  uint8_t *__n;
  uint8_t *puVar5;
  uint64_t uVar6;
  uint8_t *puVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint8_t *end_00;
  quicly_transport_parameters_t *pqVar11;
  uint8_t *puVar12;
  quicly_transport_parameters_t *pqVar13;
  ulong uVar14;
  uint8_t *puVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  uint8_t *_src;
  int local_84;
  uint8_t *local_80;
  uint8_t *local_78;
  uint8_t *local_70;
  uint8_t *local_68;
  quicly_transport_parameters_t *local_60;
  uint8_t *local_58;
  quicly_cid_t *local_50;
  quicly_cid_t *local_48;
  undefined8 *local_40;
  quicly_cid_t *local_38;
  
  pqVar11 = &default_transport_params;
  pqVar13 = params;
  for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pqVar13->max_stream_data).bidi_local = (pqVar11->max_stream_data).bidi_local;
    pqVar11 = (quicly_transport_parameters_t *)&(pqVar11->max_stream_data).bidi_remote;
    pqVar13 = (quicly_transport_parameters_t *)&(pqVar13->max_stream_data).bidi_remote;
  }
  if (original_dcid != &_tp_cid_ignore && original_dcid != (quicly_cid_t *)0x0) {
    original_dcid->len = 0xff;
  }
  if (initial_scid != &_tp_cid_ignore && initial_scid != (quicly_cid_t *)0x0) {
    initial_scid->len = 0xff;
  }
  if (retry_scid != &_tp_cid_ignore && retry_scid != (quicly_cid_t *)0x0) {
    retry_scid->len = 0xff;
  }
  local_78 = (uint8_t *)0x0;
  local_80 = src;
  local_60 = params;
  local_50 = initial_scid;
  local_48 = retry_scid;
  local_40 = (undefined8 *)stateless_reset_token;
  local_38 = original_dcid;
  do {
    if (local_80 == end) {
      if ((local_60->min_ack_delay_usec == 0xffffffffffffffff) ||
         (local_84 = 0x2000a, local_60->min_ack_delay_usec <= (ulong)local_60->max_ack_delay * 1000)
         ) {
        if ((((local_38 == (quicly_cid_t *)0x0) || (local_38->len != 0xff)) &&
            ((local_50 == (quicly_cid_t *)0x0 || (local_50->len != 0xff)))) &&
           ((local_48 == (quicly_cid_t *)0x0 || (local_48->len != 0xff)))) {
          local_84 = 0;
        }
        else {
          local_84 = 0x20008;
        }
      }
      goto LAB_00127865;
    }
    uVar4 = ptls_decode_quicint(&local_80,end);
    if (uVar4 == 0xffffffffffffffff) {
      puVar5 = (uint8_t *)0xffffffffffffffff;
LAB_00126cc7:
      local_84 = 0x20008;
      iVar8 = 4;
      puVar7 = local_78;
    }
    else {
      local_70 = local_80;
      __n = (uint8_t *)ptls_decode_quicint(&local_70,end);
      pqVar2 = local_38;
      puVar7 = local_78;
      if (__n == (uint8_t *)0xffffffffffffffff) {
        local_84 = 0x32;
        puVar5 = (uint8_t *)0xffffffffffffffff;
        iVar8 = 4;
      }
      else {
        local_80 = local_70;
        puVar5 = end + -(long)local_70;
        iVar3 = 4;
        iVar8 = iVar3;
        if (puVar5 < __n) {
          local_84 = 0x32;
        }
        else {
          end_00 = local_70 + (long)__n;
          uVar10 = 1;
          if (uVar4 == 0) {
            if (((ulong)local_78 & 1) == 0) {
              bVar18 = local_38 != (quicly_cid_t *)0x0;
              bVar17 = __n < (uint8_t *)0x15;
              if (bVar17 && bVar18) {
                if (local_38 != &_tp_cid_ignore) {
                  local_68 = __n;
                  memcpy(local_38,local_70,(size_t)__n);
                  pqVar2->len = (uint8_t)local_68;
                  __n = local_68;
                }
                puVar5 = (uint8_t *)0x0;
                local_80 = end_00;
              }
              else {
                local_84 = 0x20008;
                puVar5 = (uint8_t *)0x4;
              }
              local_78 = (uint8_t *)((ulong)local_78 | 1);
              uVar10 = 0xffffffff;
              if (bVar17 && bVar18) goto LAB_00126d1d;
LAB_0012715e:
              iVar8 = (int)puVar5;
              puVar7 = local_78;
            }
            else {
              local_84 = 0x20008;
            }
          }
          else {
LAB_00126d1d:
            uVar14 = 0xffffffff;
            if (uVar4 != 0) {
              if (uVar4 != 0xf) {
                uVar10 = (ulong)((int)uVar10 + 1);
                goto LAB_00126e27;
              }
              puVar7 = local_78;
              puVar15 = local_78;
              if (((ulong)local_78 >> (uVar10 & 0x3f) & 1) == 0) {
                bVar17 = local_50 == (quicly_cid_t *)0x0;
                uVar16 = (long)end_00 - (long)local_80;
                if (0x14 < uVar16 || bVar17) {
                  local_84 = 0x20008;
                  puVar5 = (uint8_t *)0x4;
                }
                else {
                  if (local_50 != &_tp_cid_ignore) {
                    local_68 = __n;
                    local_58 = end_00;
                    memcpy(local_50,local_80,uVar16);
                    local_50->len = (uint8_t)uVar16;
                    end_00 = local_58;
                    __n = local_68;
                  }
                  puVar5 = (uint8_t *)0x0;
                  local_80 = end_00;
                }
                local_78 = (uint8_t *)((ulong)local_78 | 1L << ((byte)uVar10 & 0x3f));
                uVar10 = 0xffffffff;
                if (0x14 < uVar16 || bVar17) goto LAB_0012715e;
                goto LAB_00126e27;
              }
              goto LAB_001274a1;
            }
            uVar10 = 0xffffffff;
LAB_00126e27:
            if (-1 < (int)uVar10) {
              if (uVar4 != 0x10) {
                uVar14 = (ulong)((int)uVar10 + 1);
                goto LAB_00126e68;
              }
              puVar7 = local_78;
              puVar15 = local_78;
              if (((ulong)local_78 >> (uVar10 & 0x3f) & 1) != 0) goto LAB_001274a1;
              bVar17 = local_48 != (quicly_cid_t *)0x0;
              uVar16 = (long)end_00 - (long)local_80;
              if (uVar16 < 0x15 && bVar17) {
                if (local_48 != &_tp_cid_ignore) {
                  local_68 = __n;
                  local_58 = end_00;
                  memcpy(local_48,local_80,uVar16);
                  local_48->len = (uint8_t)uVar16;
                  end_00 = local_58;
                  __n = local_68;
                }
                puVar5 = (uint8_t *)0x0;
                local_80 = end_00;
              }
              else {
                local_84 = 0x20008;
                puVar5 = (uint8_t *)0x4;
              }
              local_78 = (uint8_t *)((ulong)local_78 | 1L << ((byte)uVar10 & 0x3f));
              if (uVar16 < 0x15 && bVar17) goto LAB_00126e68;
LAB_001272c8:
              iVar8 = (int)puVar5;
              puVar7 = local_78;
              goto LAB_001274a6;
            }
LAB_00126e68:
            uVar10 = 0xffffffff;
            if ((int)uVar14 < 0) {
              uVar14 = 0xffffffff;
            }
            else if (uVar4 == 3) {
              puVar7 = local_78;
              puVar15 = local_78;
              if (((ulong)local_78 >> (uVar14 & 0x3f) & 1) != 0) goto LAB_001274a1;
              local_68 = __n;
              uVar6 = ptls_decode_quicint(&local_80,end_00);
              uVar16 = uVar6 - 0x4b0;
              if (uVar16 < 0xfffffffffffffb4f) {
                if (0xfffe < uVar6) {
                  uVar6 = 0xffff;
                }
                local_60->max_udp_payload_size = uVar6;
                puVar5 = (uint8_t *)0x0;
              }
              else {
                local_84 = 0x20008;
                puVar5 = (uint8_t *)0x4;
              }
              local_78 = (uint8_t *)((ulong)local_78 | 1L << ((byte)uVar14 & 0x3f));
              uVar14 = 0xffffffff;
              __n = local_68;
              if (0xfffffffffffffb4e < uVar16) goto LAB_001272c8;
            }
            else {
              uVar14 = (ulong)((int)uVar14 + 1);
            }
            if ((int)uVar14 < 0) {
LAB_00126f52:
              uVar14 = 0xffffffff;
              puVar15 = local_78;
              if ((int)uVar10 < 0) {
                uVar10 = 0xffffffff;
              }
              else if (uVar4 == 6) {
                puVar7 = local_78;
                if (((ulong)local_78 >> (uVar10 & 0x3f) & 1) != 0) goto LAB_001274a1;
                puVar15 = (uint8_t *)(1L << ((byte)uVar10 & 0x3f) | (ulong)local_78);
                uVar6 = ptls_decode_quicint(&local_80,end_00);
                (local_60->max_stream_data).bidi_remote = uVar6;
                uVar10 = 0xffffffff;
                if (uVar6 == 0xffffffffffffffff) {
                  puVar5 = (uint8_t *)0xffffffffffffffff;
                  local_78 = puVar15;
                  goto LAB_00126cc7;
                }
              }
              else {
                uVar10 = (ulong)((int)uVar10 + 1);
              }
              if (-1 < (int)uVar10) {
                if (uVar4 == 7) {
                  puVar7 = (uint8_t *)(1L << ((byte)uVar10 & 0x3f));
                  if (((ulong)puVar15 >> (uVar10 & 0x3f) & 1) != 0) goto LAB_001274a1;
                  local_78 = (uint8_t *)((ulong)puVar7 | (ulong)puVar15);
                  uVar6 = ptls_decode_quicint(&local_80,end_00);
                  (local_60->max_stream_data).uni = uVar6;
                  puVar15 = local_78;
                  puVar5 = local_78;
                  if (uVar6 == 0xffffffffffffffff) goto LAB_00126cc7;
                }
                else {
                  uVar14 = (ulong)((int)uVar10 + 1);
                }
              }
              uVar10 = 0xffffffff;
              if (-1 < (int)uVar14) {
                if (uVar4 != 4) {
                  uVar14 = (ulong)((int)uVar14 + 1);
                  goto LAB_0012716e;
                }
                puVar7 = puVar15;
                if (((ulong)puVar15 >> (uVar14 & 0x3f) & 1) == 0) {
                  puVar15 = (uint8_t *)(1L << ((byte)uVar14 & 0x3f) | (ulong)puVar15);
                  uVar6 = ptls_decode_quicint(&local_80,end_00);
                  local_60->max_data = uVar6;
                  uVar14 = 0xffffffff;
                  if (uVar6 != 0xffffffffffffffff) goto LAB_0012716e;
                  puVar7 = (uint8_t *)0xffffffffffffffff;
                }
                goto LAB_001274a1;
              }
              uVar14 = 0xffffffff;
LAB_0012716e:
              if ((int)uVar14 < 0) {
LAB_00127255:
                uVar14 = 0xffffffff;
                puVar5 = puVar15;
                if (-1 < (int)uVar10) {
                  if (uVar4 != 1) {
                    uVar10 = (ulong)((int)uVar10 + 1);
                    goto LAB_001272e2;
                  }
                  puVar7 = puVar15;
                  if (((ulong)puVar15 >> (uVar10 & 0x3f) & 1) == 0) {
                    puVar5 = (uint8_t *)(1L << ((byte)uVar10 & 0x3f) | (ulong)puVar15);
                    puVar7 = (uint8_t *)ptls_decode_quicint(&local_80,end_00);
                    local_60->max_idle_timeout = (uint64_t)puVar7;
                    uVar10 = 0xffffffff;
                    puVar15 = puVar5;
                    if (puVar7 != (uint8_t *)0xffffffffffffffff) goto LAB_001272e2;
                  }
                  goto LAB_001274a1;
                }
                uVar10 = 0xffffffff;
LAB_001272e2:
                if (-1 < (int)uVar10) {
                  if (uVar4 == 8) {
                    puVar7 = (uint8_t *)(1L << ((byte)uVar10 & 0x3f));
                    puVar15 = puVar5;
                    if (((ulong)puVar5 >> (uVar10 & 0x3f) & 1) == 0) {
                      local_78 = (uint8_t *)((ulong)puVar7 | (ulong)puVar5);
                      uVar6 = ptls_decode_quicint(&local_80,end_00);
                      local_60->max_streams_bidi = uVar6;
                      puVar5 = local_78;
                      puVar7 = local_78;
                      puVar15 = local_78;
                      if (uVar6 != 0xffffffffffffffff) goto LAB_0012734d;
                    }
LAB_001274a1:
                    local_78 = puVar15;
                    puVar5 = puVar7;
                    local_84 = 0x20008;
                    puVar7 = local_78;
                    goto LAB_001274a6;
                  }
                  uVar14 = (ulong)((int)uVar10 + 1);
                }
LAB_0012734d:
                puVar7 = puVar5;
                if (-1 < (int)uVar14) {
                  if (uVar4 != 9) {
                    uVar10 = (ulong)((int)uVar14 + 1);
                    goto LAB_00127395;
                  }
                  if (((ulong)puVar5 >> (uVar14 & 0x3f) & 1) != 0) goto LAB_00126f09;
                  puVar7 = (uint8_t *)(1L << ((byte)uVar14 & 0x3f) | (ulong)puVar5);
                  puVar5 = (uint8_t *)ptls_decode_quicint(&local_80,end_00);
                  local_60->max_streams_uni = (uint64_t)puVar5;
                  uVar10 = 0xffffffff;
                  if (puVar5 != (uint8_t *)0xffffffffffffffff) goto LAB_00127395;
LAB_0012753d:
                  local_84 = 0x20008;
                  iVar8 = 4;
                  goto LAB_001274a6;
                }
                uVar10 = 0xffffffff;
LAB_00127395:
                uVar14 = 0xffffffff;
                if (-1 < (int)uVar10) {
                  if (uVar4 == 10) {
                    puVar15 = (uint8_t *)(1L << ((byte)uVar10 & 0x3f));
                    puVar5 = puVar15;
                    if (((ulong)puVar7 >> (uVar10 & 0x3f) & 1) != 0) goto LAB_0012753d;
                    local_68 = __n;
                    puVar5 = (uint8_t *)ptls_decode_quicint(&local_80,end_00);
                    if (puVar5 < (uint8_t *)0x15) {
                      local_60->ack_delay_exponent = (uint8_t)puVar5;
                      iVar8 = 0;
                    }
                    else {
                      local_84 = 0x20008;
                      iVar8 = 4;
                    }
                    uVar14 = 0xffffffff;
                    puVar7 = (uint8_t *)((ulong)puVar15 | (ulong)puVar7);
                    __n = local_68;
                    if ((uint8_t *)0x14 < puVar5) goto LAB_001274a6;
                  }
                  else {
                    uVar14 = (ulong)((int)uVar10 + 1);
                  }
                }
                uVar10 = 0xffffffff;
                if ((int)uVar14 < 0) {
LAB_001274b8:
                  puVar5 = puVar7;
                  if ((recognize_delayed_ack != 0) && (-1 < (int)uVar10)) {
                    if (uVar4 == 0xff02de1a) {
                      puVar5 = (uint8_t *)(1L << ((byte)uVar10 & 0x3f));
                      if (((ulong)puVar7 >> (uVar10 & 0x3f) & 1) != 0) {
                        local_84 = 0x20008;
                        iVar8 = 4;
                        goto LAB_001274a6;
                      }
                      puVar15 = (uint8_t *)ptls_decode_quicint(&local_80,end_00);
                      local_60->min_ack_delay_usec = (uint64_t)puVar15;
                      uVar10 = 0xffffffff;
                      puVar12 = (uint8_t *)((ulong)puVar7 | (ulong)puVar5);
                      puVar5 = (uint8_t *)((ulong)puVar7 | (ulong)puVar5);
                      if ((uint8_t *)0xffffff < puVar15) goto LAB_001276f6;
                    }
                    else {
                      uVar10 = (ulong)((int)uVar10 + 1);
                    }
                  }
                  uVar14 = 0xffffffff;
                  if ((int)uVar10 < 0) {
                    uVar10 = 0xffffffff;
                  }
                  else if (uVar4 == 0xe) {
                    puVar15 = (uint8_t *)(1L << ((byte)uVar10 & 0x3f));
                    puVar12 = puVar5;
                    if (((ulong)puVar5 >> (uVar10 & 0x3f) & 1) != 0) goto LAB_001276f6;
                    local_68 = __n;
                    local_58 = end_00;
                    uVar6 = ptls_decode_quicint(&local_80,end_00);
                    iVar8 = 0;
                    bVar17 = 2 < uVar6 + 1;
                    if (bVar17) {
                      local_60->active_connection_id_limit = uVar6;
                    }
                    else {
                      local_84 = 0x20008;
                      iVar8 = 4;
                    }
                    puVar5 = (uint8_t *)((ulong)puVar15 | (ulong)puVar5);
                    uVar10 = 0xffffffff;
                    end_00 = local_58;
                    __n = local_68;
                    puVar7 = puVar5;
                    if (!bVar17) goto LAB_001274a6;
                  }
                  else {
                    uVar10 = (ulong)((int)uVar10 + 1);
                  }
                  if (-1 < (int)uVar10) {
                    if (uVar4 == 0xc) {
                      puVar7 = (uint8_t *)(1L << ((byte)uVar10 & 0x3f));
                      if (((ulong)puVar5 >> (uVar10 & 0x3f) & 1) != 0) goto LAB_00126f09;
                      puVar5 = (uint8_t *)((ulong)puVar5 | (ulong)puVar7);
                      local_60->field_0x50 = local_60->field_0x50 | 1;
                    }
                    else {
                      uVar14 = (ulong)((int)uVar10 + 1);
                    }
                  }
                  local_78 = puVar5;
                  if ((int)uVar14 < 0) {
                    bVar17 = false;
                  }
                  else {
                    bVar17 = true;
                    if (uVar4 == 0x20) {
                      if (((ulong)puVar5 >> (uVar14 & 0x3f) & 1) != 0) goto LAB_00127641;
                      local_68 = __n;
                      puVar5 = (uint8_t *)ptls_decode_quicint(&local_80,end_00);
                      if (puVar5 == (uint8_t *)0xffffffffffffffff) {
                        local_84 = 0x20008;
                        iVar8 = 4;
                      }
                      else {
                        puVar7 = (uint8_t *)0xffff;
                        if (puVar5 < (uint8_t *)0xffff) {
                          puVar7 = puVar5;
                        }
                        local_60->max_datagram_frame_size = (uint16_t)puVar7;
                        iVar8 = 0;
                      }
                      puVar7 = (uint8_t *)((ulong)local_78 | 1L << ((byte)uVar14 & 0x3f));
                      if (puVar5 == (uint8_t *)0xffffffffffffffff) goto LAB_001274a6;
                      bVar17 = false;
                      local_78 = puVar7;
                    }
                  }
                  if (bVar17) {
                    local_80 = end_00;
                  }
                  puVar5 = (uint8_t *)0x32;
                  if (local_80 != end_00) {
                    local_84 = 0x32;
                  }
                  iVar8 = (uint)(local_80 != end_00) << 2;
                  puVar7 = local_78;
                }
                else {
                  if (uVar4 != 0xb) {
                    uVar10 = (ulong)((int)uVar14 + 1);
                    goto LAB_001274b8;
                  }
                  puVar15 = puVar5;
                  puVar12 = puVar7;
                  if (((ulong)puVar7 >> (uVar14 & 0x3f) & 1) == 0) {
                    local_68 = __n;
                    local_58 = end_00;
                    puVar5 = (uint8_t *)ptls_decode_quicint(&local_80,end_00);
                    if (puVar5 < (uint8_t *)0x4000) {
                      local_60->max_ack_delay = (uint16_t)puVar5;
                      iVar8 = 0;
                    }
                    else {
                      local_84 = 0x20008;
                      iVar8 = 4;
                    }
                    puVar7 = (uint8_t *)((ulong)puVar7 | 1L << ((byte)uVar14 & 0x3f));
                    end_00 = local_58;
                    __n = local_68;
                    if ((uint8_t *)0x3fff < puVar5) goto LAB_001274a6;
                    goto LAB_001274b8;
                  }
LAB_001276f6:
                  puVar5 = puVar15;
                  local_84 = 0x20008;
                  iVar8 = 4;
                  puVar7 = puVar12;
                }
              }
              else {
                if (uVar4 != 2) {
                  uVar10 = (ulong)((int)uVar14 + 1);
                  goto LAB_00127255;
                }
                puVar7 = (uint8_t *)(1L << ((byte)uVar14 & 0x3f));
                if ((((ulong)puVar15 >> (uVar14 & 0x3f) & 1) != 0) ||
                   (puVar15 = (uint8_t *)((ulong)puVar7 | (ulong)puVar15), puVar7 = puVar15,
                   local_40 == (undefined8 *)0x0)) goto LAB_001274a1;
                puVar5 = local_80;
                local_78 = puVar15;
                if ((long)end_00 - (long)local_80 == 0x10) {
                  uVar1 = *(undefined8 *)(local_80 + 8);
                  *local_40 = *(undefined8 *)local_80;
                  local_40[1] = uVar1;
                  local_80 = end_00;
                  goto LAB_00127255;
                }
LAB_00127641:
                local_84 = 0x20008;
                iVar8 = iVar3;
                puVar7 = local_78;
              }
            }
            else {
              if (uVar4 != 5) {
                uVar10 = (ulong)((int)uVar14 + 1);
                goto LAB_00126f52;
              }
              puVar7 = (uint8_t *)(1L << ((byte)uVar14 & 0x3f));
              puVar5 = local_78;
              if (((ulong)local_78 >> (uVar14 & 0x3f) & 1) == 0) {
                local_78 = (uint8_t *)((ulong)local_78 | (ulong)puVar7);
                uVar6 = ptls_decode_quicint(&local_80,end_00);
                (local_60->max_stream_data).bidi_local = uVar6;
                if (uVar6 == 0xffffffffffffffff) {
                  puVar5 = (uint8_t *)0xffffffffffffffff;
                  goto LAB_00126cc7;
                }
                goto LAB_00126f52;
              }
LAB_00126f09:
              local_78 = puVar5;
              puVar5 = puVar7;
              local_84 = 0x20008;
              iVar8 = 4;
              puVar7 = local_78;
            }
          }
        }
      }
    }
LAB_001274a6:
    local_78 = puVar7;
    iVar3 = (int)puVar5;
  } while (iVar8 == 0);
  if (iVar8 == 4) {
LAB_00127865:
    iVar3 = 0x20008;
    if (local_84 != 0x32) {
      iVar3 = local_84;
    }
  }
  return iVar3;
}

Assistant:

int quicly_decode_transport_parameter_list(quicly_transport_parameters_t *params, quicly_cid_t *original_dcid,
                                           quicly_cid_t *initial_scid, quicly_cid_t *retry_scid, void *stateless_reset_token,
                                           const uint8_t *src, const uint8_t *end, int recognize_delayed_ack)
{
/* When non-negative, tp_index contains the literal position within the list of transport parameters recognized by this function.
 * That index is being used to find duplicates using a 64-bit bitmap (found_bits). When the transport parameter is being processed,
 * tp_index is set to -1. */
#define DECODE_TP(_id, block)                                                                                                      \
    do {                                                                                                                           \
        if (tp_index >= 0) {                                                                                                       \
            if (id == (_id)) {                                                                                                     \
                if ((found_bits & ((uint64_t)1 << tp_index)) != 0) {                                                               \
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;                                                              \
                    goto Exit;                                                                                                     \
                }                                                                                                                  \
                found_bits |= (uint64_t)1 << tp_index;                                                                             \
                {block} tp_index = -1;                                                                                             \
            } else {                                                                                                               \
                ++tp_index;                                                                                                        \
            }                                                                                                                      \
        }                                                                                                                          \
    } while (0)
#define DECODE_CID_TP(_id, dest)                                                                                                   \
    DECODE_TP(_id, {                                                                                                               \
        size_t cidl = end - src;                                                                                                   \
        if (cidl > QUICLY_MAX_CID_LEN_V1) {                                                                                        \
            ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;                                                                      \
            goto Exit;                                                                                                             \
        }                                                                                                                          \
        if (dest == NULL) {                                                                                                        \
            ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;                                                                      \
            goto Exit;                                                                                                             \
        } else if (dest != &tp_cid_ignore) {                                                                                       \
            quicly_set_cid(dest, ptls_iovec_init(src, cidl));                                                                      \
        }                                                                                                                          \
        src = end;                                                                                                                 \
    });

    uint64_t found_bits = 0;
    int ret;

    /* set parameters to their default values */
    *params = default_transport_params;

    /* Set optional parameters to UINT8_MAX. It is used to as a sentinel for detecting missing TPs. */
    if (original_dcid != NULL && original_dcid != &tp_cid_ignore)
        original_dcid->len = UINT8_MAX;
    if (initial_scid != NULL && initial_scid != &tp_cid_ignore)
        initial_scid->len = UINT8_MAX;
    if (retry_scid != NULL && retry_scid != &tp_cid_ignore)
        retry_scid->len = UINT8_MAX;

    /* decode the parameters block */
    while (src != end) {
        uint64_t id;
        if ((id = quicly_decodev(&src, end)) == UINT64_MAX) {
            ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
            goto Exit;
        }
        int tp_index = 0;
        ptls_decode_open_block(src, end, -1, {
            DECODE_CID_TP(QUICLY_TRANSPORT_PARAMETER_ID_ORIGINAL_CONNECTION_ID, original_dcid);
            DECODE_CID_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_SOURCE_CONNECTION_ID, initial_scid);
            DECODE_CID_TP(QUICLY_TRANSPORT_PARAMETER_ID_RETRY_SOURCE_CONNECTION_ID, retry_scid);
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_MAX_UDP_PAYLOAD_SIZE, {
                uint64_t v;
                if ((v = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v < 1200) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v > UINT16_MAX)
                    v = UINT16_MAX;
                params->max_udp_payload_size = (uint16_t)v;
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_LOCAL, {
                if ((params->max_stream_data.bidi_local = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_REMOTE, {
                if ((params->max_stream_data.bidi_remote = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_UNI, {
                if ((params->max_stream_data.uni = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_DATA, {
                if ((params->max_data = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_STATELESS_RESET_TOKEN, {
                if (!(stateless_reset_token != NULL && end - src == QUICLY_STATELESS_RESET_TOKEN_LEN)) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                memcpy(stateless_reset_token, src, QUICLY_STATELESS_RESET_TOKEN_LEN);
                src = end;
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_MAX_IDLE_TIMEOUT, {
                if ((params->max_idle_timeout = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_BIDI, {
                if ((params->max_streams_bidi = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_UNI, {
                if ((params->max_streams_uni = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_ACK_DELAY_EXPONENT, {
                uint64_t v;
                if ((v = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v > 20) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                params->ack_delay_exponent = (uint8_t)v;
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_MAX_ACK_DELAY, {
                uint64_t v;
                if ((v = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v >= 16384) { /* "values of 2^14 or greater are invalid" */
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                params->max_ack_delay = (uint16_t)v;
            });
            /* min_ack_delay is recognized only if the support is enabled on this endpoint */
            if (recognize_delayed_ack) {
                DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_MIN_ACK_DELAY, {
                    if ((params->min_ack_delay_usec = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                        ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                        goto Exit;
                    }
                    if (params->min_ack_delay_usec >= 16777216) { /* "values of 2^24 or greater are invalid" */
                        ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                        goto Exit;
                    }
                });
            }
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_ACTIVE_CONNECTION_ID_LIMIT, {
                uint64_t v;
                if ((v = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v < QUICLY_MIN_ACTIVE_CONNECTION_ID_LIMIT) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                params->active_connection_id_limit = v;
            });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_DISABLE_ACTIVE_MIGRATION, { params->disable_active_migration = 1; });
            DECODE_TP(QUICLY_TRANSPORT_PARAMETER_ID_MAX_DATAGRAM_FRAME_SIZE, {
                uint64_t v;
                if ((v = ptls_decode_quicint(&src, end)) == UINT64_MAX) {
                    ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                    goto Exit;
                }
                if (v > UINT16_MAX)
                    v = UINT16_MAX;
                params->max_datagram_frame_size = (uint16_t)v;
            });
            /* skip unknown extension */
            if (tp_index >= 0)
                src = end;
        });
    }

    /* check consistency between the transpart parameters */
    if (params->min_ack_delay_usec != UINT64_MAX) {
        if (params->min_ack_delay_usec > params->max_ack_delay * 1000) {
            ret = QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
            goto Exit;
        }
    }

    /* check the absence of CIDs */
    if ((original_dcid != NULL && original_dcid->len == UINT8_MAX) || (initial_scid != NULL && initial_scid->len == UINT8_MAX) ||
        (retry_scid != NULL && retry_scid->len == UINT8_MAX)) {
        ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
        goto Exit;
    }

    ret = 0;
Exit:
    if (ret == PTLS_ALERT_DECODE_ERROR)
        ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
    return ret;

#undef DECODE_TP
#undef DECODE_CID_TP
}